

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

bool __thiscall BacktraceData::Add(BacktraceData *this,cmListFileBacktrace *bt,ArrayIndex *index)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  ArrayIndex AVar4;
  _Hash_node_base *p_Var5;
  Value *pVVar6;
  mapped_type *pmVar7;
  __hash_code __code;
  ulong uVar8;
  __node_base_ptr p_Var9;
  __node_base_ptr p_Var10;
  cmListFileContext *top;
  ArrayIndex parent;
  Value entry;
  cmListFileContext *local_90;
  UInt local_84;
  undefined1 local_80 [40];
  Value local_58;
  
  bVar2 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                    (&bt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
  if (!bVar2) {
    local_90 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                         (&bt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
    uVar1 = (this->NodeMap)._M_h._M_bucket_count;
    uVar8 = (ulong)local_90 % uVar1;
    p_Var9 = (this->NodeMap)._M_h._M_buckets[uVar8];
    p_Var10 = (__node_base_ptr)0x0;
    if ((p_Var9 != (__node_base_ptr)0x0) &&
       (p_Var5 = p_Var9->_M_nxt, p_Var10 = p_Var9,
       local_90 != (cmListFileContext *)p_Var9->_M_nxt[1]._M_nxt)) {
      while (p_Var9 = p_Var5, p_Var5 = p_Var9->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
        p_Var10 = (__node_base_ptr)0x0;
        if (((ulong)p_Var5[1]._M_nxt % uVar1 != uVar8) ||
           (p_Var10 = p_Var9, local_90 == (cmListFileContext *)p_Var5[1]._M_nxt)) goto LAB_0029d878;
      }
      p_Var10 = (__node_base_ptr)0x0;
    }
LAB_0029d878:
    if (p_Var10 == (__node_base_ptr)0x0) {
      p_Var5 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var5 = p_Var10->_M_nxt;
    }
    if (p_Var5 == (_Hash_node_base *)0x0) {
      Json::Value::Value(&local_58,objectValue);
      AVar4 = AddFile(this,&local_90->FilePath);
      Json::Value::Value((Value *)local_80,AVar4);
      pVVar6 = Json::Value::operator[](&local_58,"file");
      Json::Value::operator=(pVVar6,(Value *)local_80);
      Json::Value::~Value((Value *)local_80);
      if (local_90->Line != 0) {
        Json::Value::Value((Value *)local_80,(Int)local_90->Line);
        pVVar6 = Json::Value::operator[](&local_58,"line");
        Json::Value::operator=(pVVar6,(Value *)local_80);
        Json::Value::~Value((Value *)local_80);
      }
      if ((local_90->Name)._M_string_length != 0) {
        AVar4 = AddCommand(this,&local_90->Name);
        Json::Value::Value((Value *)local_80,AVar4);
        pVVar6 = Json::Value::operator[](&local_58,"command");
        Json::Value::operator=(pVVar6,(Value *)local_80);
        Json::Value::~Value((Value *)local_80);
      }
      cmConstStack<cmListFileContext,_cmListFileBacktrace>::Pop
                ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_80);
      bVar3 = Add(this,(cmListFileBacktrace *)local_80,&local_84);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
      }
      if (bVar3) {
        Json::Value::Value((Value *)local_80,local_84);
        pVVar6 = Json::Value::operator[](&local_58,"parent");
        Json::Value::operator=(pVVar6,(Value *)local_80);
        Json::Value::~Value((Value *)local_80);
      }
      AVar4 = Json::Value::size(&this->Nodes);
      pmVar7 = std::__detail::
               _Map_base<const_cmListFileContext_*,_std::pair<const_cmListFileContext_*const,_unsigned_int>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmListFileContext_*>,_std::hash<const_cmListFileContext_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_cmListFileContext_*,_std::pair<const_cmListFileContext_*const,_unsigned_int>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmListFileContext_*>,_std::hash<const_cmListFileContext_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->NodeMap,&local_90);
      *pmVar7 = AVar4;
      *index = AVar4;
      Json::Value::append(&this->Nodes,&local_58);
      Json::Value::~Value(&local_58);
    }
    else {
      *index = *(ArrayIndex *)&p_Var5[2]._M_nxt;
    }
  }
  return !bVar2;
}

Assistant:

bool BacktraceData::Add(cmListFileBacktrace const& bt, Json::ArrayIndex& index)
{
  if (bt.Empty()) {
    return false;
  }
  cmListFileContext const* top = &bt.Top();
  auto found = this->NodeMap.find(top);
  if (found != this->NodeMap.end()) {
    index = found->second;
    return true;
  }
  Json::Value entry = Json::objectValue;
  entry["file"] = this->AddFile(top->FilePath);
  if (top->Line) {
    entry["line"] = static_cast<int>(top->Line);
  }
  if (!top->Name.empty()) {
    entry["command"] = this->AddCommand(top->Name);
  }
  Json::ArrayIndex parent;
  if (this->Add(bt.Pop(), parent)) {
    entry["parent"] = parent;
  }
  index = this->NodeMap[top] = this->Nodes.size();
  this->Nodes.append(std::move(entry)); // NOLINT(*)
  return true;
}